

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.hpp
# Opt level: O2

bool __thiscall
trial::online::detail::close_to<double>::operator()(close_to<double> *this,double *lhs,double *rhs)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ABS(*lhs);
  dVar2 = ABS(*rhs);
  if (dVar2 <= dVar1) {
    dVar2 = dVar1;
  }
  dVar2 = dVar2 * this->relative;
  dVar1 = this->absolute;
  if (this->absolute <= dVar2) {
    dVar1 = dVar2;
  }
  return ABS(*lhs - *rhs) < dVar1;
}

Assistant:

constexpr bool operator() (const T& lhs, const T& rhs) const noexcept
    {
        return std::abs(lhs - rhs) < std::max(relative * std::max(std::abs(lhs), std::abs(rhs)), absolute);
    }